

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

ssize_t __thiscall
zmq::detail::socket_base::send(socket_base *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  ulong uVar2;
  error_t *this_00;
  undefined4 in_register_00000034;
  
  uVar1 = zmq_send(this->_handle,CONCAT44(in_register_00000034,__fd));
  if ((int)uVar1 < 0) {
    uVar2 = zmq_errno();
    if ((int)uVar2 != 0xb) {
      this_00 = (error_t *)__cxa_allocate_exception(0x10);
      error_t::error_t(this_00);
      __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
    }
  }
  else {
    uVar2 = (ulong)uVar1;
  }
  return uVar2;
}

Assistant:

detail::send_result_t send(const_buffer buf, send_flags flags = send_flags::none)
    {
        const int nbytes =
          zmq_send(_handle, buf.data(), buf.size(), static_cast<int>(flags));
        if (nbytes >= 0)
            return static_cast<size_t>(nbytes);
        if (zmq_errno() == EAGAIN)
            return {};
        throw error_t();
    }